

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageMipmaps(Image *image)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  bool bVar10;
  Image imCopy;
  
  pvVar8 = image->data;
  if (((pvVar8 != (void *)0x0) && (iVar5 = image->width, iVar5 != 0)) &&
     (iVar6 = image->height, iVar6 != 0)) {
    iVar1 = image->format;
    iVar4 = GetPixelDataSize(iVar5,iVar6,iVar1);
    iVar9 = 0;
    while (iVar6 != 1 || iVar5 != 1) {
      iVar5 = iVar5 / 2;
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      iVar6 = iVar6 / 2;
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      iVar7 = GetPixelDataSize(iVar5,iVar6,iVar1);
      iVar4 = iVar4 + iVar7;
      iVar9 = iVar9 + 1;
    }
    if (iVar9 + 1 <= image->mipmaps) {
      TraceLog(4,"IMAGE: Mipmaps already available");
      return;
    }
    pvVar8 = realloc(pvVar8,(long)iVar4);
    if (pvVar8 == (void *)0x0) {
      TraceLog(4,"IMAGE: Mipmaps required memory could not be allocated");
      pvVar8 = image->data;
    }
    else {
      image->data = pvVar8;
    }
    iVar5 = image->width;
    iVar6 = image->height;
    iVar1 = image->format;
    iVar4 = GetPixelDataSize(iVar5,iVar6,iVar1);
    pvVar8 = (void *)((long)iVar4 + (long)pvVar8);
    uVar2 = (long)iVar5 / 2;
    uVar3 = (long)iVar6 / 2;
    iVar5 = GetPixelDataSize((int)uVar2,(int)uVar3,iVar1);
    ImageCopy(*image);
    while( true ) {
      bVar10 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      if (bVar10) break;
      ImageResize(&imCopy,(int)uVar2,(int)uVar3);
      memcpy(pvVar8,imCopy.data,(long)iVar5);
      image->mipmaps = image->mipmaps + 1;
      pvVar8 = (void *)((long)pvVar8 + (long)iVar5);
      uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 2;
      uVar3 = (long)(int)uVar3 / 2;
      if ((int)uVar2 < 2) {
        uVar2 = 1;
      }
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      iVar5 = GetPixelDataSize((int)uVar2,(int)uVar3,image->format);
    }
    free(imCopy.data);
  }
  return;
}

Assistant:

void ImageMipmaps(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    int mipCount = 1;                   // Required mipmap levels count (including base level)
    int mipWidth = image->width;        // Base image width
    int mipHeight = image->height;      // Base image height
    int mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);  // Image data size (in bytes)

    // Count mipmap levels required
    while ((mipWidth != 1) || (mipHeight != 1))
    {
        if (mipWidth != 1) mipWidth /= 2;
        if (mipHeight != 1) mipHeight /= 2;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;

        TRACELOGD("IMAGE: Next mipmap level: %i x %i - current size %i", mipWidth, mipHeight, mipSize);

        mipCount++;
        mipSize += GetPixelDataSize(mipWidth, mipHeight, image->format);       // Add mipmap size (in bytes)
    }

    if (image->mipmaps < mipCount)
    {
        void *temp = RL_REALLOC(image->data, mipSize);

        if (temp != NULL) image->data = temp;      // Assign new pointer (new size) to store mipmaps data
        else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps required memory could not be allocated");

        // Pointer to allocated memory point where store next mipmap level data
        unsigned char *nextmip = (unsigned char *)image->data + GetPixelDataSize(image->width, image->height, image->format);

        mipWidth = image->width/2;
        mipHeight = image->height/2;
        mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        Image imCopy = ImageCopy(*image);

        for (int i = 1; i < mipCount; i++)
        {
            TRACELOGD("IMAGE: Generating mipmap level: %i (%i x %i) - size: %i - offset: 0x%x", i, mipWidth, mipHeight, mipSize, nextmip);

            ImageResize(&imCopy, mipWidth, mipHeight);  // Uses internally Mitchell cubic downscale filter

            memcpy(nextmip, imCopy.data, mipSize);
            nextmip += mipSize;
            image->mipmaps++;

            mipWidth /= 2;
            mipHeight /= 2;

            // Security check for NPOT textures
            if (mipWidth < 1) mipWidth = 1;
            if (mipHeight < 1) mipHeight = 1;

            mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        }

        UnloadImage(imCopy);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps already available");
}